

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

void * google::protobuf::internal::TcParser::MaybeGetSplitBase
                 (MessageLite *msg,bool is_split,TcParseTableBase *table)

{
  MessageLite *__src;
  undefined8 *puVar1;
  void *__dest;
  MessageLite *pMVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000031;
  Arena *this;
  ulong __n;
  
  pMVar2 = msg;
  if ((int)CONCAT71(in_register_00000031,is_split) != 0) {
    puVar1 = (undefined8 *)
             ((long)&table->class_data->prototype->_vptr_MessageLite +
             (ulong)*(uint *)(&table->fast_idx_mask + table->aux_offset));
    if (((ulong)puVar1 & 7) != 0) {
      AlignFail(puVar1);
    }
    puVar3 = (undefined8 *)
             ((long)&msg->_vptr_MessageLite +
             (ulong)*(uint *)(&table->fast_idx_mask + table->aux_offset));
    if (((ulong)puVar3 & 7) != 0) {
      AlignFail(puVar3);
    }
    __src = (MessageLite *)*puVar1;
    pMVar2 = (MessageLite *)*puVar3;
    if ((MessageLite *)*puVar3 == __src) {
      __n = (ulong)*(uint *)((long)&table->field_entries_offset + (ulong)table->aux_offset);
      this = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)this & 1) != 0) {
        this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
      }
      if (this == (Arena *)0x0) {
        __dest = operator_new(__n);
      }
      else {
        __dest = Arena::Allocate(this,__n + 7 & 0xfffffffffffffff8);
      }
      *puVar3 = __dest;
      memcpy(__dest,__src,__n);
      pMVar2 = (MessageLite *)*puVar3;
    }
  }
  return pMVar2;
}

Assistant:

void* TcParser::MaybeGetSplitBase(MessageLite* msg, const bool is_split,
                                  const TcParseTableBase* table) {
  void* out = msg;
  if (is_split) {
    const uint32_t split_offset = GetSplitOffset(table);
    void* default_split =
        TcParser::RefAt<void*>(table->default_instance(), split_offset);
    void*& split = TcParser::RefAt<void*>(msg, split_offset);
    if (split == default_split) {
      // Allocate split instance when needed.
      uint32_t size = GetSizeofSplit(table);
      Arena* arena = msg->GetArena();
      split = (arena == nullptr) ? ::operator new(size)
                                 : arena->AllocateAligned(size);
      memcpy(split, default_split, size);
    }
    out = split;
  }
  return out;
}